

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O0

void reset_and_init(ixgbe_device *dev)

{
  mac_address mVar1;
  uint uVar2;
  ixy_device *unaff_RBX;
  device_stats *in_RDI;
  uint uVar3;
  uint mask;
  int in_stack_0000000c;
  ixgbe_device *in_stack_00000010;
  uint16_t queue;
  uint16_t i_1;
  uint16_t i;
  mac_address mac;
  ixgbe_device *in_stack_00000070;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb4;
  uint32_t in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  ushort local_24;
  ushort local_22;
  undefined2 in_stack_ffffffffffffffe0;
  ushort uVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  uint8_t uVar10;
  
  fprintf(_stdout,"[INFO ] %s:%d %s(): Resetting device %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
          0x1bf,"reset_and_init",in_RDI->device);
  disable_interrupts((ixgbe_device *)0x105608);
  set_reg32((uint8_t *)in_RDI[2].tx_bytes,0,0x4000008);
  wait_clear_reg32((uint8_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  usleep(10000);
  disable_interrupts((ixgbe_device *)0x10564f);
  mVar1 = ixgbe_get_mac_addr((ixy_device *)
                             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  bVar5 = mVar1.addr[0];
  bVar6 = mVar1.addr[1];
  bVar7 = mVar1.addr[2];
  bVar8 = mVar1.addr[3];
  bVar9 = mVar1.addr[4];
  uVar10 = mVar1.addr[5];
  fprintf(_stdout,"[INFO ] %s:%d %s(): Initializing device %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
          0x1cd,"reset_and_init",in_RDI->device);
  uVar2 = (uint)bVar7;
  mask = (uint)bVar8;
  uVar3 = (uint)bVar9;
  fprintf(_stdout,"[INFO ] %s:%d %s(): MAC address %02x:%02x:%02x:%02x:%02x:%02x\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
          0x1ce,"reset_and_init",(ulong)bVar5,(uint)bVar6);
  wait_set_reg32((uint8_t *)CONCAT44(in_stack_ffffffffffffffc4,uVar3),in_stack_ffffffffffffffbc,mask
                );
  wait_set_reg32((uint8_t *)CONCAT44(in_stack_ffffffffffffffc4,uVar3),in_stack_ffffffffffffffbc,mask
                );
  init_link((ixgbe_device *)CONCAT44(in_stack_ffffffffffffffb4,uVar2));
  ixgbe_read_stats(unaff_RBX,in_RDI);
  init_rx(in_stack_00000070);
  init_tx((ixgbe_device *)
          CONCAT17(uVar10,CONCAT16(bVar9,CONCAT15(bVar8,CONCAT14(bVar7,CONCAT13(bVar6,CONCAT12(bVar5
                                                  ,in_stack_ffffffffffffffe0)))))));
  for (uVar4 = 0; uVar4 < (ushort)in_RDI->tx_pkts; uVar4 = uVar4 + 1) {
    start_rx_queue(in_stack_00000010,in_stack_0000000c);
  }
  for (local_22 = 0; local_22 < *(ushort *)((long)&in_RDI->tx_pkts + 2); local_22 = local_22 + 1) {
    start_tx_queue((ixgbe_device *)CONCAT44(in_stack_ffffffffffffffb4,uVar2),
                   in_stack_ffffffffffffffac);
  }
  for (local_24 = 0; local_24 < (ushort)in_RDI->tx_pkts; local_24 = local_24 + 1) {
    enable_interrupt((ixgbe_device *)CONCAT44(in_stack_ffffffffffffffb4,uVar2),
                     (uint16_t)((uint)in_stack_ffffffffffffffac >> 0x10));
  }
  ixgbe_set_promisc((ixy_device *)CONCAT44(in_stack_ffffffffffffffc4,uVar3),
                    SUB41((uint)in_stack_ffffffffffffffbc >> 0x18,0));
  wait_for_link((ixgbe_device *)CONCAT44(in_stack_ffffffffffffffc4,uVar3));
  return;
}

Assistant:

static void reset_and_init(struct ixgbe_device* dev) {
	info("Resetting device %s", dev->ixy.pci_addr);

	// section 4.6.3.1 - disable all interrupts
	disable_interrupts(dev);
	// section 4.6.3.2
	set_reg32(dev->addr, IXGBE_CTRL, IXGBE_CTRL_RST_MASK);
	wait_clear_reg32(dev->addr, IXGBE_CTRL, IXGBE_CTRL_RST_MASK);
	usleep(10000);

	// section 4.6.3.1 - disable interrupts again after reset
	disable_interrupts(dev);

	struct mac_address mac = ixgbe_get_mac_addr(&dev->ixy);

	info("Initializing device %s", dev->ixy.pci_addr);
	info("MAC address %02x:%02x:%02x:%02x:%02x:%02x", mac.addr[0], mac.addr[1], mac.addr[2], mac.addr[3], mac.addr[4], mac.addr[5]);

	// section 4.6.3 - Wait for EEPROM auto read completion
	wait_set_reg32(dev->addr, IXGBE_EEC, IXGBE_EEC_ARD);

	// section 4.6.3 - Wait for DMA initialization done (RDRXCTL.DMAIDONE)
	wait_set_reg32(dev->addr, IXGBE_RDRXCTL, IXGBE_RDRXCTL_DMAIDONE);

	// section 4.6.4 - initialize link (auto negotiation)
	init_link(dev);

	// section 4.6.5 - statistical counters
	// reset-on-read registers, just read them once
	ixgbe_read_stats(&dev->ixy, NULL);

	// section 4.6.7 - init rx
	init_rx(dev);

	// section 4.6.8 - init tx
	init_tx(dev);

	// enables queues after initializing everything
	for (uint16_t i = 0; i < dev->ixy.num_rx_queues; i++) {
		start_rx_queue(dev, i);
	}
	for (uint16_t i = 0; i < dev->ixy.num_tx_queues; i++) {
		start_tx_queue(dev, i);
	}

	// enable interrupts
	for (uint16_t queue = 0; queue < dev->ixy.num_rx_queues; queue++) {
		enable_interrupt(dev, queue);
	}

	// finally, enable promisc mode by default, it makes testing less annoying
	ixgbe_set_promisc(&dev->ixy, true);

	// wait for some time for the link to come up
	wait_for_link(dev);
}